

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O3

void GD::save_load_online_state(vw *all,io_buf *model_file,bool read,bool text,gd *g)

{
  bool bVar1;
  ostream *poVar2;
  double *pdVar3;
  float *pfVar4;
  uint64_t *puVar5;
  float dump_interval;
  double total_weight;
  size_t temp_pass;
  stringstream msg;
  float local_1d4;
  double local_1d0;
  gd *local_1c8;
  uint64_t local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  local_1c8 = g;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"initial_t ",10);
  poVar2 = std::ostream::_M_insert<double>((double)all->initial_t);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if (read) {
    io_buf::bin_read_fixed(model_file,(char *)&all->initial_t,4,"");
  }
  else {
    bin_text_write_fixed(model_file,(char *)&all->initial_t,4,(stringstream *)local_1b8,text);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"norm normalizer ",0x10);
  poVar2 = std::ostream::_M_insert<double>(all->normalized_sum_norm_x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if (read) {
    io_buf::bin_read_fixed(model_file,(char *)&all->normalized_sum_norm_x,8,"");
  }
  else {
    bin_text_write_fixed
              (model_file,(char *)&all->normalized_sum_norm_x,8,(stringstream *)local_1b8,text);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"t ",2);
  poVar2 = std::ostream::_M_insert<double>(all->sd->t);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  pdVar3 = &all->sd->t;
  if (read) {
    io_buf::bin_read_fixed(model_file,(char *)pdVar3,8,"");
  }
  else {
    bin_text_write_fixed(model_file,(char *)pdVar3,8,(stringstream *)local_1b8,text);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"sum_loss ",9);
  poVar2 = std::ostream::_M_insert<double>(all->sd->sum_loss);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  pdVar3 = &all->sd->sum_loss;
  if (read) {
    io_buf::bin_read_fixed(model_file,(char *)pdVar3,8,"");
  }
  else {
    bin_text_write_fixed(model_file,(char *)pdVar3,8,(stringstream *)local_1b8,text);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"sum_loss_since_last_dump ",0x19);
  poVar2 = std::ostream::_M_insert<double>(all->sd->sum_loss_since_last_dump);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  pdVar3 = &all->sd->sum_loss_since_last_dump;
  if (read) {
    io_buf::bin_read_fixed(model_file,(char *)pdVar3,8,"");
  }
  else {
    bin_text_write_fixed(model_file,(char *)pdVar3,8,(stringstream *)local_1b8,text);
  }
  local_1d4 = all->sd->dump_interval;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"dump_interval ",0xe);
  poVar2 = std::ostream::_M_insert<double>((double)local_1d4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if (read) {
    io_buf::bin_read_fixed(model_file,(char *)&local_1d4,4,"");
    if ((all->training == true) && (all->preserve_performance_counters == true)) goto LAB_0013f51e;
  }
  else {
    bin_text_write_fixed(model_file,(char *)&local_1d4,4,(stringstream *)local_1b8,text);
LAB_0013f51e:
    all->sd->dump_interval = local_1d4;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"min_label ",10);
  poVar2 = std::ostream::_M_insert<double>((double)all->sd->min_label);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  pfVar4 = &all->sd->min_label;
  if (read) {
    io_buf::bin_read_fixed(model_file,(char *)pfVar4,4,"");
  }
  else {
    bin_text_write_fixed(model_file,(char *)pfVar4,4,(stringstream *)local_1b8,text);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"max_label ",10);
  poVar2 = std::ostream::_M_insert<double>((double)all->sd->max_label);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  pfVar4 = &all->sd->max_label;
  if (read) {
    io_buf::bin_read_fixed(model_file,(char *)pfVar4,4,"");
  }
  else {
    bin_text_write_fixed(model_file,(char *)pfVar4,4,(stringstream *)local_1b8,text);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"weighted_labeled_examples ",0x1a);
  poVar2 = std::ostream::_M_insert<double>(all->sd->weighted_labeled_examples);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  pdVar3 = &all->sd->weighted_labeled_examples;
  if (read) {
    io_buf::bin_read_fixed(model_file,(char *)pdVar3,8,"");
  }
  else {
    bin_text_write_fixed(model_file,(char *)pdVar3,8,(stringstream *)local_1b8,text);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"weighted_labels ",0x10);
  poVar2 = std::ostream::_M_insert<double>(all->sd->weighted_labels);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  pdVar3 = &all->sd->weighted_labels;
  if (read) {
    io_buf::bin_read_fixed(model_file,(char *)pdVar3,8,"");
  }
  else {
    bin_text_write_fixed(model_file,(char *)pdVar3,8,(stringstream *)local_1b8,text);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"weighted_unlabeled_examples ",0x1c);
  poVar2 = std::ostream::_M_insert<double>(all->sd->weighted_unlabeled_examples);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  pdVar3 = &all->sd->weighted_unlabeled_examples;
  if (read) {
    io_buf::bin_read_fixed(model_file,(char *)pdVar3,8,"");
  }
  else {
    bin_text_write_fixed(model_file,(char *)pdVar3,8,(stringstream *)local_1b8,text);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"example_number ",0xf);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  puVar5 = &all->sd->example_number;
  if (read) {
    io_buf::bin_read_fixed(model_file,(char *)puVar5,8,"");
  }
  else {
    bin_text_write_fixed(model_file,(char *)puVar5,8,(stringstream *)local_1b8,text);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"total_features ",0xf);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  puVar5 = &all->sd->total_features;
  if (read) {
    io_buf::bin_read_fixed(model_file,(char *)puVar5,8,"");
    bVar1 = version_struct::operator>=(&all->model_file_ver,"7.10.1");
    if (bVar1) {
      local_1d0 = 0.0;
      bVar1 = local_1c8 != (gd *)0x0;
      goto LAB_0013f890;
    }
  }
  else {
    bin_text_write_fixed(model_file,(char *)puVar5,8,(stringstream *)local_1b8,text);
    local_1d0 = 0.0;
    if (local_1c8 == (gd *)0x0) {
      bVar1 = false;
    }
    else {
      local_1d0 = local_1c8->total_weight;
      bVar1 = true;
    }
LAB_0013f890:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"gd::total_weight ",0x11);
    poVar2 = std::ostream::_M_insert<double>(local_1d0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    if (read) {
      io_buf::bin_read_fixed(model_file,(char *)&local_1d0,8,"");
      if (bVar1) {
        local_1c8->total_weight = local_1d0;
      }
    }
    else {
      bin_text_write_fixed(model_file,(char *)&local_1d0,8,(stringstream *)local_1b8,text);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"sd::oec.weighted_labeled_examples ",0x22);
    poVar2 = std::ostream::_M_insert<double>(all->sd->old_weighted_labeled_examples);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    pdVar3 = &all->sd->old_weighted_labeled_examples;
    if (read) {
      io_buf::bin_read_fixed(model_file,(char *)pdVar3,8,"");
    }
    else {
      bin_text_write_fixed(model_file,(char *)pdVar3,8,(stringstream *)local_1b8,text);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"current_pass ",0xd);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    bVar1 = version_struct::operator>=(&all->model_file_ver,"8.3.3");
    puVar5 = &all->current_pass;
    if (bVar1) {
      if (!read) {
        bin_text_write_fixed(model_file,(char *)puVar5,8,(stringstream *)local_1b8,text);
        goto LAB_0013fabc;
      }
      io_buf::bin_read_fixed(model_file,(char *)puVar5,8,"");
    }
    else {
      local_1c0 = *puVar5;
      if (!read) {
        bin_text_write_fixed(model_file,(char *)&local_1c0,8,(stringstream *)local_1b8,text);
        *puVar5 = local_1c0;
        goto LAB_0013fabc;
      }
      io_buf::bin_read_fixed(model_file,(char *)&local_1c0,8,"");
      *puVar5 = local_1c0;
    }
  }
  if ((all->training != true) || (all->preserve_performance_counters == false)) {
    all->sd->sum_loss = 0.0;
    all->sd->sum_loss_since_last_dump = 0.0;
    all->sd->weighted_labeled_examples = 0.0;
    all->sd->weighted_labels = 0.0;
    all->sd->weighted_unlabeled_examples = 0.0;
    all->sd->old_weighted_labeled_examples = 0.0;
    all->sd->example_number = 0;
    all->sd->total_features = 0;
    all->current_pass = 0;
  }
LAB_0013fabc:
  if ((all->weights).sparse == true) {
    save_load_online_state<sparse_parameters>
              (all,model_file,read,text,local_1c8,(stringstream *)local_1b8,
               &(all->weights).sparse_weights);
  }
  else {
    save_load_online_state<dense_parameters>
              (all,model_file,read,text,local_1c8,(stringstream *)local_1b8,
               &(all->weights).dense_weights);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

void save_load_online_state(vw& all, io_buf& model_file, bool read, bool text, gd* g)
{
  // vw& all = *g.all;
  stringstream msg;

  msg << "initial_t " << all.initial_t << "\n";
  bin_text_read_write_fixed(model_file, (char*)&all.initial_t, sizeof(all.initial_t), "", read, msg, text);

  msg << "norm normalizer " << all.normalized_sum_norm_x << "\n";
  bin_text_read_write_fixed(
      model_file, (char*)&all.normalized_sum_norm_x, sizeof(all.normalized_sum_norm_x), "", read, msg, text);

  msg << "t " << all.sd->t << "\n";
  bin_text_read_write_fixed(model_file, (char*)&all.sd->t, sizeof(all.sd->t), "", read, msg, text);

  msg << "sum_loss " << all.sd->sum_loss << "\n";
  bin_text_read_write_fixed(model_file, (char*)&all.sd->sum_loss, sizeof(all.sd->sum_loss), "", read, msg, text);

  msg << "sum_loss_since_last_dump " << all.sd->sum_loss_since_last_dump << "\n";
  bin_text_read_write_fixed(model_file, (char*)&all.sd->sum_loss_since_last_dump,
      sizeof(all.sd->sum_loss_since_last_dump), "", read, msg, text);

  float dump_interval = all.sd->dump_interval;
  msg << "dump_interval " << dump_interval << "\n";
  bin_text_read_write_fixed(model_file, (char*)&dump_interval, sizeof(dump_interval), "", read, msg, text);
  if (!read || (all.training && all.preserve_performance_counters))  // update dump_interval from input model
    all.sd->dump_interval = dump_interval;

  msg << "min_label " << all.sd->min_label << "\n";
  bin_text_read_write_fixed(model_file, (char*)&all.sd->min_label, sizeof(all.sd->min_label), "", read, msg, text);

  msg << "max_label " << all.sd->max_label << "\n";
  bin_text_read_write_fixed(model_file, (char*)&all.sd->max_label, sizeof(all.sd->max_label), "", read, msg, text);

  msg << "weighted_labeled_examples " << all.sd->weighted_labeled_examples << "\n";
  bin_text_read_write_fixed(model_file, (char*)&all.sd->weighted_labeled_examples,
      sizeof(all.sd->weighted_labeled_examples), "", read, msg, text);

  msg << "weighted_labels " << all.sd->weighted_labels << "\n";
  bin_text_read_write_fixed(
      model_file, (char*)&all.sd->weighted_labels, sizeof(all.sd->weighted_labels), "", read, msg, text);

  msg << "weighted_unlabeled_examples " << all.sd->weighted_unlabeled_examples << "\n";
  bin_text_read_write_fixed(model_file, (char*)&all.sd->weighted_unlabeled_examples,
      sizeof(all.sd->weighted_unlabeled_examples), "", read, msg, text);

  msg << "example_number " << all.sd->example_number << "\n";
  bin_text_read_write_fixed(
      model_file, (char*)&all.sd->example_number, sizeof(all.sd->example_number), "", read, msg, text);

  msg << "total_features " << all.sd->total_features << "\n";
  bin_text_read_write_fixed(
      model_file, (char*)&all.sd->total_features, sizeof(all.sd->total_features), "", read, msg, text);

  if (!read || all.model_file_ver >= VERSION_SAVE_RESUME_FIX)
  {
    // restore some data to allow --save_resume work more accurate

    // fix average loss
    double total_weight = 0.;  // value holder as g* may be null
    if (!read && g != nullptr)
      total_weight = g->total_weight;
    msg << "gd::total_weight " << total_weight << "\n";
    bin_text_read_write_fixed(model_file, (char*)&total_weight, sizeof(total_weight), "", read, msg, text);
    if (read && g != nullptr)
      g->total_weight = total_weight;

    // fix "loss since last" for first printed out example details
    msg << "sd::oec.weighted_labeled_examples " << all.sd->old_weighted_labeled_examples << "\n";
    bin_text_read_write_fixed(model_file, (char*)&all.sd->old_weighted_labeled_examples,
        sizeof(all.sd->old_weighted_labeled_examples), "", read, msg, text);

    // fix "number of examples per pass"
    msg << "current_pass " << all.current_pass << "\n";
    if (all.model_file_ver >= VERSION_PASS_UINT64)
      bin_text_read_write_fixed(model_file, (char*)&all.current_pass, sizeof(all.current_pass), "", read, msg, text);
    else  // backwards compatiblity.
    {
      size_t temp_pass = (size_t)all.current_pass;
      bin_text_read_write_fixed(model_file, (char*)&temp_pass, sizeof(temp_pass), "", read, msg, text);
      all.current_pass = temp_pass;
    }
  }

  if (read &&
      (!all.training ||
          !all.preserve_performance_counters))  // reset various things so that we report test set performance properly
  {
    all.sd->sum_loss = 0;
    all.sd->sum_loss_since_last_dump = 0;
    all.sd->weighted_labeled_examples = 0.;
    all.sd->weighted_labels = 0.;
    all.sd->weighted_unlabeled_examples = 0.;
    all.sd->old_weighted_labeled_examples = 0.;
    all.sd->example_number = 0;
    all.sd->total_features = 0;
    all.current_pass = 0;
  }
  if (all.weights.sparse)
    save_load_online_state(all, model_file, read, text, g, msg, all.weights.sparse_weights);
  else
    save_load_online_state(all, model_file, read, text, g, msg, all.weights.dense_weights);
}